

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
           (FractionalInteger *param_1,FractionalInteger *param_2)

{
  bool bVar1;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  *p_Var2;
  reference this;
  undefined8 extraout_RDX;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar3;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  pivot_pos;
  bool already_partitioned;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  last;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  first;
  T pivot;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_ffffffffffffff18;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_ffffffffffffff20;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  *in_stack_ffffffffffffff28;
  byte local_ba;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a8;
  FractionalInteger *local_a0;
  FractionalInteger *local_98;
  undefined1 local_89;
  FractionalInteger *local_88;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_70;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_68 [9];
  FractionalInteger *local_20;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_18;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_10;
  undefined1 local_8;
  
  local_20 = param_2;
  local_18._M_current = param_1;
  __gnu_cxx::
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  ::operator*(&local_18);
  FractionalInteger::FractionalInteger
            (in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18._M_current);
  local_68[0]._M_current = local_18._M_current;
  local_70._M_current = local_20;
  do {
    p_Var2 = __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator++(local_68);
    __gnu_cxx::
    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
    ::operator*(p_Var2);
    bVar1 = std::less<FractionalInteger>::operator()
                      ((less<FractionalInteger> *)in_stack_ffffffffffffff20._M_current,
                       in_stack_ffffffffffffff18._M_current,(FractionalInteger *)0x6ae1be);
  } while (bVar1);
  local_88 = (FractionalInteger *)
             __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator-(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)in_stack_ffffffffffffff20._M_current,
                     (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)in_stack_ffffffffffffff18._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_ffffffffffffff20._M_current,
                         (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_ffffffffffffff18._M_current);
      local_ba = 0;
      if (bVar1) {
        p_Var2 = __gnu_cxx::
                 __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                 ::operator--(&local_70);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(p_Var2);
        bVar1 = std::less<FractionalInteger>::operator()
                          ((less<FractionalInteger> *)in_stack_ffffffffffffff20._M_current,
                           in_stack_ffffffffffffff18._M_current,(FractionalInteger *)0x6ae26c);
        local_ba = bVar1 ^ 0xff;
      }
    } while ((local_ba & 1) != 0);
  }
  else {
    do {
      p_Var2 = __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator--(&local_70);
      __gnu_cxx::
      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
      ::operator*(p_Var2);
      bVar1 = std::less<FractionalInteger>::operator()
                        ((less<FractionalInteger> *)in_stack_ffffffffffffff20._M_current,
                         in_stack_ffffffffffffff18._M_current,(FractionalInteger *)0x6ae2b6);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_89 = __gnu_cxx::operator>=
                       ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         *)in_stack_ffffffffffffff20._M_current,
                        (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         *)in_stack_ffffffffffffff18._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                             *)in_stack_ffffffffffffff20._M_current,
                            (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                             *)in_stack_ffffffffffffff18._M_current), bVar1) {
    local_98 = local_68[0]._M_current;
    local_a0 = local_70._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    do {
      p_Var2 = __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator++(local_68);
      __gnu_cxx::
      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
      ::operator*(p_Var2);
      bVar1 = std::less<FractionalInteger>::operator()
                        ((less<FractionalInteger> *)in_stack_ffffffffffffff20._M_current,
                         in_stack_ffffffffffffff18._M_current,(FractionalInteger *)0x6ae352);
    } while (bVar1);
    do {
      p_Var2 = __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator--(&local_70);
      __gnu_cxx::
      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
      ::operator*(p_Var2);
      bVar1 = std::less<FractionalInteger>::operator()
                        ((less<FractionalInteger> *)in_stack_ffffffffffffff20._M_current,
                         in_stack_ffffffffffffff18._M_current,(FractionalInteger *)0x6ae390);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_a8 = __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator-(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20._M_current);
  p_Var2 = &local_a8;
  this = __gnu_cxx::
         __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
         ::operator*(p_Var2);
  __gnu_cxx::
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  ::operator*(&local_18);
  FractionalInteger::operator=(this,in_stack_ffffffffffffff18._M_current);
  __gnu_cxx::
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  ::operator*(p_Var2);
  FractionalInteger::operator=(this,in_stack_ffffffffffffff18._M_current);
  pVar3 = std::
          make_pair<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>&,bool&>
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)this,(bool *)in_stack_ffffffffffffff18._M_current);
  local_10 = pVar3.first._M_current;
  local_8 = pVar3.second;
  FractionalInteger::~FractionalInteger((FractionalInteger *)0x6ae459);
  pVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar3.second = (bool)local_8;
  pVar3.first._M_current = local_10._M_current;
  return pVar3;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }